

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder_get_available_frames(ma_decoder *pDecoder,ma_uint64 *pAvailableFrames)

{
  long *in_RSI;
  ma_uint64 *in_RDI;
  ma_uint64 totalFrameCount;
  ma_result result;
  ulong local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ma_result mVar1;
  
  if (in_RSI == (long *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    *in_RSI = 0;
    if (in_RDI == (ma_uint64 *)0x0) {
      mVar1 = MA_INVALID_ARGS;
    }
    else {
      mVar1 = ma_decoder_get_length_in_pcm_frames
                        ((ma_decoder *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                         ,in_RDI);
      if (mVar1 == MA_SUCCESS) {
        if (in_RDI[0x10] < local_28) {
          *in_RSI = local_28 - in_RDI[0x10];
        }
        else {
          *in_RSI = 0;
        }
        mVar1 = MA_SUCCESS;
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_decoder_get_available_frames(ma_decoder* pDecoder, ma_uint64* pAvailableFrames)
{
    ma_result result;
    ma_uint64 totalFrameCount;

    if (pAvailableFrames == NULL) {
        return MA_INVALID_ARGS;
    }

    *pAvailableFrames = 0;

    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_decoder_get_length_in_pcm_frames(pDecoder, &totalFrameCount);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (totalFrameCount <= pDecoder->readPointerInPCMFrames) {
        *pAvailableFrames = 0;
    } else {
        *pAvailableFrames = totalFrameCount - pDecoder->readPointerInPCMFrames;
    }

    return MA_SUCCESS;
}